

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double calc_kurtosis<float,long_double>
                 (size_t *ix_arr,size_t st,size_t end,float *x,MissingAction missing_action)

{
  bool bVar1;
  size_t row;
  size_t sVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble local_e8;
  longdouble local_dc;
  longdouble local_d0;
  longdouble local_b8;
  long local_a8;
  ushort uStack_a0;
  long local_98;
  short sStack_90;
  long local_88;
  ushort uStack_80;
  long local_78;
  short sStack_70;
  longdouble local_6c;
  
  if (missing_action == Fail) {
    lVar9 = (longdouble)0;
    lVar4 = 0;
    local_e8 = lVar9;
    local_b8 = lVar9;
    local_6c = lVar9;
    while (st + lVar4 <= end) {
      lVar3 = lVar4 + 1;
      lVar6 = (longdouble)lVar3 + (longdouble)(float)(&DAT_003250d8)[lVar3 < 0];
      lVar7 = ((longdouble)x[ix_arr[st + lVar4]] - local_6c) / lVar6;
      lVar8 = ((longdouble)lVar4 + (longdouble)(float)(&DAT_003250d8)[lVar4 < 0]) * lVar7 *
              ((longdouble)x[ix_arr[st + lVar4]] - local_6c);
      local_e8 = local_e8 +
                 lVar7 * (longdouble)-4.0 * local_b8 +
                 (lVar6 * lVar6 + (longdouble)-3.0 * lVar6 + (longdouble)3.0) *
                 lVar8 * lVar7 * lVar7 + lVar7 * lVar7 * (longdouble)6.0 * lVar9;
      local_6c = local_6c + lVar7;
      local_b8 = local_b8 +
                 (longdouble)-3.0 * lVar7 * lVar9 + (lVar6 + (longdouble)-2.0) * lVar8 * lVar7;
      lVar9 = lVar8 + lVar9;
      lVar4 = lVar3;
    }
    if (!NAN(lVar9)) {
      sStack_90 = (short)((unkuint10)lVar9 >> 0x40);
      uVar5 = (int)sStack_90 & 0x7fff;
      local_98 = SUB108(lVar9,0);
      if (((byte)((byte)((unkuint10)lVar9 >> 0x38) >> 7 & sStack_90 < 0 &
                  (uVar5 - 1 & 0xffff) < 0x7ffe |
                 (local_98 == 0 && (ulong)uVar5 == 0 ||
                 ((ulong)uVar5 - 1) + (ulong)(local_98 != 0) <
                 (ulong)(local_98 - 1U < 0x7fffffffffffffff) && sStack_90 < 0)) == 1) &&
         (bVar1 = check_more_than_two_unique_values<float>(ix_arr,st,end,x,Fail), !bVar1)) {
        return -INFINITY;
      }
    }
    lVar4 = (end - st) + 1;
    lVar9 = (((longdouble)lVar4 + (longdouble)(float)(&DAT_003250d8)[lVar4 < 0]) / lVar9) *
            (local_e8 / lVar9);
    uStack_a0 = (ushort)((unkuint10)lVar9 >> 0x40);
    local_a8 = SUB108(lVar9,0);
    if (((unkuint10)lVar9 & 0x7fff) == 0 ||
        (ushort)((uStack_a0 & 0x7fff) - 1) < 0x7ffe && local_a8 < 0) {
LAB_00255b61:
      if ((double)lVar9 <= 0.0) {
        return 0.0;
      }
      return (double)lVar9;
    }
  }
  else {
    lVar9 = (longdouble)0;
    lVar4 = 0;
    local_e8 = lVar9;
    local_dc = lVar9;
    local_d0 = lVar9;
    for (sVar2 = st; sVar2 <= end; sVar2 = sVar2 + 1) {
      lVar3 = lVar4;
      if ((uint)ABS(x[ix_arr[sVar2]]) < 0x7f800000) {
        lVar3 = lVar4 + 1;
        lVar6 = (longdouble)lVar3 + (longdouble)(float)(&DAT_003250d8)[lVar3 < 0];
        lVar7 = (longdouble)x[ix_arr[sVar2]] - local_dc;
        lVar8 = lVar7 / lVar6;
        lVar7 = ((longdouble)lVar4 + (longdouble)(float)(&DAT_003250d8)[lVar4 < 0]) * lVar8 * lVar7;
        local_e8 = local_e8 +
                   lVar8 * (longdouble)-4.0 * local_d0 +
                   (lVar6 * lVar6 + (longdouble)-3.0 * lVar6 + (longdouble)3.0) *
                   lVar8 * lVar8 * lVar7 + lVar8 * lVar8 * (longdouble)6.0 * lVar9;
        local_dc = local_dc + lVar8;
        local_d0 = local_d0 +
                   (longdouble)-3.0 * lVar8 * lVar9 + (lVar6 + (longdouble)-2.0) * lVar8 * lVar7;
        lVar9 = lVar7 + lVar9;
      }
      lVar4 = lVar3;
    }
    if (lVar4 != 0) {
      if (!NAN(lVar9)) {
        sStack_70 = (short)((unkuint10)lVar9 >> 0x40);
        uVar5 = (int)sStack_70 & 0x7fff;
        local_78 = SUB108(lVar9,0);
        if (((byte)((byte)((unkuint10)lVar9 >> 0x38) >> 7 & sStack_70 < 0 &
                    (uVar5 - 1 & 0xffff) < 0x7ffe |
                   (local_78 == 0 && (ulong)uVar5 == 0 ||
                   ((ulong)uVar5 - 1) + (ulong)(local_78 != 0) <
                   (ulong)(local_78 - 1U < 0x7fffffffffffffff) && sStack_70 < 0)) == 1) &&
           (bVar1 = check_more_than_two_unique_values<float>(ix_arr,st,end,x,missing_action), !bVar1
           )) {
          return -INFINITY;
        }
      }
      lVar9 = (((longdouble)lVar4 + (longdouble)(float)(&DAT_003250d8)[lVar4 < 0]) / lVar9) *
              (local_e8 / lVar9);
      uStack_80 = (ushort)((unkuint10)lVar9 >> 0x40);
      local_88 = SUB108(lVar9,0);
      if (((unkuint10)lVar9 & 0x7fff) == 0 ||
          (ushort)((uStack_80 & 0x7fff) - 1) < 0x7ffe && local_88 < 0) goto LAB_00255b61;
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis(size_t ix_arr[], size_t st, size_t end, real_t x[], MissingAction missing_action)
{
    ldouble_safe m = 0;
    ldouble_safe M2 = 0, M3 = 0, M4 = 0;
    ldouble_safe delta, delta_s, delta_div;
    ldouble_safe diff, n;
    ldouble_safe out;

    if (missing_action == Fail)
    {
        for (size_t row = st; row <= end; row++)
        {
            n  =  (ldouble_safe)(row - st + 1);

            delta      =  x[ix_arr[row]] - m;
            delta_div  =  delta / n;
            delta_s    =  delta_div * delta_div;
            diff       =  delta * (delta_div * (ldouble_safe)(row - st));

            m   +=  delta_div;
            M4  +=  diff * delta_s * (n * n - 3 * n + 3) + 6 * delta_s * M2 - 4 * delta_div * M3;
            M3  +=  diff * delta_div * (n - 2) - 3 * delta_div * M2;
            M2  +=  diff;
        }

        if (unlikely(!is_na_or_inf(M2) && M2 <= 0))
        {
            if (!check_more_than_two_unique_values(ix_arr, st, end, x, missing_action))
                return -HUGE_VAL;
        }

        out = ( M4 / M2 ) * ( (ldouble_safe)(end - st + 1) / M2 );
        return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
    }

    else
    {
        size_t cnt = 0;
        for (size_t row = st; row <= end; row++)
        {
            if (likely(!is_na_or_inf(x[ix_arr[row]])))
            {
                cnt++;
                n = (ldouble_safe) cnt;

                delta      =  x[ix_arr[row]] - m;
                delta_div  =  delta / n;
                delta_s    =  delta_div * delta_div;
                diff       =  delta * (delta_div * (ldouble_safe)(cnt - 1));

                m   +=  delta_div;
                M4  +=  diff * delta_s * (n * n - 3 * n + 3) + 6 * delta_s * M2 - 4 * delta_div * M3;
                M3  +=  diff * delta_div * (n - 2) - 3 * delta_div * M2;
                M2  +=  diff;
            }
        }

        if (unlikely(cnt == 0)) return -HUGE_VAL;
        if (unlikely(!is_na_or_inf(M2) && M2 <= 0))
        {
            if (!check_more_than_two_unique_values(ix_arr, st, end, x, missing_action))
                return -HUGE_VAL;
        }

        out = ( M4 / M2 ) * ( (ldouble_safe)cnt / M2 );
        return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
    }
}